

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_sBIT(ucvector *out,LodePNGInfo *info)

{
  LodePNGColorType LVar1;
  uint uVar2;
  uchar *chunk;
  uchar *local_18;
  
  LVar1 = (info->color).colortype;
  uVar2 = 8;
  if (LVar1 != LCT_PALETTE) {
    uVar2 = (info->color).bitdepth;
  }
  local_18 = (uchar *)0x0;
  switch(LVar1) {
  case LCT_GREY:
    if (uVar2 <= info->sbit_r - 1) {
      return 0x73;
    }
    uVar2 = lodepng_chunk_init(&local_18,out,1,"sBIT");
    if (uVar2 != 0) {
      return uVar2;
    }
    local_18[8] = (uchar)info->sbit_r;
    break;
  case LCT_RGB:
  case LCT_PALETTE:
    if (info->sbit_r == 0) {
      return 0x73;
    }
    if (info->sbit_g == 0) {
      return 0x73;
    }
    if (info->sbit_b == 0) {
      return 0x73;
    }
    if (uVar2 < info->sbit_b || (uVar2 < info->sbit_g || uVar2 < info->sbit_r)) {
      return 0x73;
    }
    uVar2 = lodepng_chunk_init(&local_18,out,3,"sBIT");
    if (uVar2 != 0) {
      return uVar2;
    }
    local_18[8] = (uchar)info->sbit_r;
    local_18[9] = (uchar)info->sbit_g;
    local_18[10] = (uchar)info->sbit_b;
    break;
  case LCT_GREY_ALPHA:
    if (info->sbit_r == 0) {
      return 0x73;
    }
    if (info->sbit_a == 0) {
      return 0x73;
    }
    if (uVar2 < info->sbit_a || uVar2 < info->sbit_r) {
      return 0x73;
    }
    uVar2 = lodepng_chunk_init(&local_18,out,2,"sBIT");
    if (uVar2 != 0) {
      return uVar2;
    }
    local_18[8] = (uchar)info->sbit_r;
    local_18[9] = (uchar)info->sbit_a;
    break;
  case LCT_RGBA:
    if (info->sbit_r == 0) {
      return 0x73;
    }
    if (info->sbit_g == 0) {
      return 0x73;
    }
    if (info->sbit_b == 0) {
      return 0x73;
    }
    if (uVar2 < info->sbit_r) {
      return 0x73;
    }
    if (uVar2 < info->sbit_g) {
      return 0x73;
    }
    if (uVar2 < info->sbit_b) {
      return 0x73;
    }
    if (uVar2 <= info->sbit_a - 1) {
      return 0x73;
    }
    uVar2 = lodepng_chunk_init(&local_18,out,4,"sBIT");
    if (uVar2 != 0) {
      return uVar2;
    }
    local_18[8] = (uchar)info->sbit_r;
    local_18[9] = (uchar)info->sbit_g;
    local_18[10] = (uchar)info->sbit_b;
    local_18[0xb] = (uchar)info->sbit_a;
  }
  if (local_18 != (uchar *)0x0) {
    lodepng_chunk_generate_crc(local_18);
  }
  return 0;
}

Assistant:

static unsigned addChunk_sBIT(ucvector* out, const LodePNGInfo* info) {
  unsigned bitdepth = (info->color.colortype == LCT_PALETTE) ? 8 : info->color.bitdepth;
  unsigned char* chunk = 0;
  if(info->color.colortype == LCT_GREY) {
    if(info->sbit_r == 0 || info->sbit_r > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 1, "sBIT"));
    chunk[8] = info->sbit_r;
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_PALETTE) {
    if(info->sbit_r == 0 || info->sbit_g == 0 || info->sbit_b == 0) return 115;
    if(info->sbit_r > bitdepth || info->sbit_g > bitdepth || info->sbit_b > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 3, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_g;
    chunk[10] = info->sbit_b;
  } else if(info->color.colortype == LCT_GREY_ALPHA) {
    if(info->sbit_r == 0 || info->sbit_a == 0) return 115;
    if(info->sbit_r > bitdepth || info->sbit_a > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_a;
  } else if(info->color.colortype == LCT_RGBA) {
    if(info->sbit_r == 0 || info->sbit_g == 0 || info->sbit_b == 0 || info->sbit_a == 0 ||
       info->sbit_r > bitdepth || info->sbit_g > bitdepth ||
       info->sbit_b > bitdepth || info->sbit_a > bitdepth) {
      return 115;
    }
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 4, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_g;
    chunk[10] = info->sbit_b;
    chunk[11] = info->sbit_a;
  }
  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}